

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEdit::setCalendarPopup(QDateTimeEdit *this,bool enable)

{
  long *plVar1;
  
  plVar1 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  if ((bool)*(char *)((long)plVar1 + 0x4fa) == enable) {
    return;
  }
  QWidget::setAttribute((QWidget *)this,WA_MacShowFocusRect,!enable);
  *(bool *)((long)plVar1 + 0x4fa) = enable;
  (**(code **)(*plVar1 + 0x100))(plVar1);
  QWidget::update((QWidget *)this);
  return;
}

Assistant:

void QDateTimeEdit::setCalendarPopup(bool enable)
{
    Q_D(QDateTimeEdit);
    if (enable == d->calendarPopup)
        return;
    setAttribute(Qt::WA_MacShowFocusRect, !enable);
    d->calendarPopup = enable;
#ifdef QT_KEYPAD_NAVIGATION
    if (!enable)
        d->focusOnButton = false;
#endif
    d->updateEditFieldGeometry();
    update();
}